

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O1

Span * __thiscall tcmalloc::PageHeap::NewWithSizeClass(PageHeap *this,Length n,uint32_t sizeclass)

{
  Span *span;
  bool bVar1;
  undefined1 local_30 [8];
  LockingContext context;
  
  context.heap = (PageHeap *)0x0;
  LOCK();
  bVar1 = (this->lock_).lockword_.super___atomic_base<int>._M_i == 0;
  if (bVar1) {
    (this->lock_).lockword_.super___atomic_base<int>._M_i = 1;
  }
  UNLOCK();
  local_30 = (undefined1  [8])this;
  if (!bVar1) {
    SpinLock::SlowLock(&this->lock_);
  }
  span = NewLocked(this,n,(LockingContext *)local_30);
  if ((span != (Span *)0x0) &&
     ((this->pagemap_cache_).array_[span->start & 0xffff] = span->start & 0xffffffffffff0000 | 0x80,
     sizeclass != 0)) {
    RegisterSizeClass(this,span,sizeclass);
  }
  LockingContext::~LockingContext((LockingContext *)local_30);
  return span;
}

Assistant:

Span* PageHeap::NewWithSizeClass(Length n, uint32_t sizeclass) {
  LockingContext context{this, &lock_};

  Span* span = NewLocked(n, &context);
  if (!span) {
    return span;
  }
  InvalidateCachedSizeClass(span->start);
  if (sizeclass) {
    RegisterSizeClass(span, sizeclass);
  }
  return span;
}